

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall google::protobuf::MessageLite::ParseFromArray(MessageLite *this,void *data,int size)

{
  MessageFactory *pMVar1;
  uint uVar2;
  LogMessage *other;
  MessageLite *message;
  bool local_151;
  int size_local;
  void *data_local;
  MessageLite *this_local;
  undefined1 local_100 [8];
  CodedInputStream input;
  LogFinisher local_85 [13];
  string local_78;
  LogMessage local_58;
  MessageFactory *local_20;
  CodedInputStream *local_18;
  char local_9;
  
  input.extension_factory_ = (MessageFactory *)this;
  io::CodedInputStream::CodedInputStream((CodedInputStream *)local_100,(uint8 *)data,size);
  pMVar1 = input.extension_factory_;
  (*(input.extension_factory_)->_vptr_MessageFactory[4])();
  local_20 = pMVar1;
  local_18 = (CodedInputStream *)local_100;
  uVar2 = (*pMVar1->_vptr_MessageFactory[8])(pMVar1,(CodedInputStream *)local_100);
  if ((uVar2 & 1) == 0) {
    local_9 = '\0';
  }
  else {
    uVar2 = (*local_20->_vptr_MessageFactory[5])();
    if ((uVar2 & 1) == 0) {
      message = (MessageLite *)0x7b;
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/message_lite.cc"
                 ,0x7b);
      (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
                (&local_78,(_anonymous_namespace_ *)"parse",(char *)local_20,message);
      other = internal::LogMessage::operator<<(&local_58,&local_78);
      internal::LogFinisher::operator=(local_85,other);
      std::__cxx11::string::~string((string *)&local_78);
      internal::LogMessage::~LogMessage(&local_58);
      local_9 = '\0';
    }
    else {
      local_9 = '\x01';
    }
  }
  local_151 = false;
  if (local_9 != '\0') {
    local_151 = io::CodedInputStream::ConsumedEntireMessage((CodedInputStream *)local_100);
  }
  io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_100);
  return local_151;
}

Assistant:

bool MessageLite::ParseFromArray(const void* data, int size) {
  return InlineParseFromArray(data, size, this);
}